

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O0

uint highbd_masked_sad8xh_avx2
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  ulong *in_stack_00000008;
  int sad;
  __m256i pred;
  __m256i pred_r;
  __m256i mask_r;
  __m256i data_r;
  __m256i pred_l;
  __m256i mask_l;
  __m256i data_l;
  __m256i m_inv;
  __m256i m;
  __m256i b;
  __m256i a;
  __m256i src;
  __m256i one;
  __m256i round_const;
  __m256i mask_max;
  __m256i res;
  int y;
  uint16_t *b_ptr;
  uint16_t *a_ptr;
  uint16_t *src_ptr;
  void *lo;
  void *hi;
  undefined1 in_stack_fffffffffffff760 [32];
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6a0 [32];
  undefined4 local_66c;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_6a0 = ZEXT1632(ZEXT816(0));
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar3 = vpinsrw_avx(auVar2,0x40,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar2 = vpinsrw_avx(auVar2,0x40,2);
  auVar2 = vpinsrw_avx(auVar2,0x40,3);
  auVar2 = vpinsrw_avx(auVar2,0x40,4);
  auVar2 = vpinsrw_avx(auVar2,0x40,5);
  auVar2 = vpinsrw_avx(auVar2,0x40,6);
  auVar2 = vpinsrw_avx(auVar2,0x40,7);
  uStack_490 = auVar2._0_8_;
  uStack_488 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar2 = vpinsrd_avx(auVar2,0x20,2);
  auVar2 = vpinsrd_avx(auVar2,0x20,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar1 = vpinsrd_avx(auVar1,0x20,2);
  auVar1 = vpinsrd_avx(auVar1,0x20,3);
  uStack_70 = auVar1._0_8_;
  uStack_68 = auVar1._8_8_;
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar4 = vpinsrw_avx(auVar4,1,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,1,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,1,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  auVar9._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar4;
  auVar9._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar10 = auVar9;
  for (local_66c = 0; local_66c < m_stride; local_66c = local_66c + 2) {
    hi = in_stack_fffffffffffff760._8_8_;
    lo = in_stack_fffffffffffff760._0_8_;
    yy_loadu2_128(hi,lo);
    auVar11 = auVar10;
    yy_loadu2_128(hi,lo);
    auVar12 = auVar11;
    yy_loadu2_128(hi,lo);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *in_stack_00000008;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)((long)in_stack_00000008 + (long)(int)m_ptr);
    auVar1 = vpunpcklqdq_avx(auVar4,auVar1);
    auVar5 = vpmovzxbw_avx2(auVar1);
    auVar7._16_8_ = uStack_490;
    auVar7._0_16_ = auVar3;
    auVar7._24_8_ = uStack_488;
    auVar6 = vpsubw_avx2(auVar7,auVar5);
    auVar7 = vpunpcklwd_avx2(auVar11,auVar12);
    auVar8 = vpunpcklwd_avx2(auVar5,auVar6);
    auVar7 = vpmaddwd_avx2(auVar7,auVar8);
    auVar8._16_8_ = uStack_70;
    auVar8._0_16_ = auVar2;
    auVar8._24_8_ = uStack_68;
    auVar7 = vpaddd_avx2(auVar7,auVar8);
    auVar8 = vpsrad_avx2(auVar7,ZEXT416(6));
    auVar7 = vpunpckhwd_avx2(auVar11,auVar12);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar6);
    auVar7 = vpmaddwd_avx2(auVar7,auVar5);
    auVar5._16_8_ = uStack_70;
    auVar5._0_16_ = auVar2;
    auVar5._24_8_ = uStack_68;
    auVar7 = vpaddd_avx2(auVar7,auVar5);
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(6));
    auVar7 = vpackssdw_avx2(auVar8,auVar7);
    auVar10 = vpsubw_avx2(auVar7,auVar10);
    in_stack_fffffffffffff760 = vpabsw_avx2(auVar10);
    uStack_6f0 = auVar9._16_8_;
    uStack_6e8 = auVar9._24_8_;
    auVar10._16_8_ = uStack_6f0;
    auVar10._0_16_ = auVar9._0_16_;
    auVar10._24_8_ = uStack_6e8;
    auVar10 = vpmaddwd_avx2(in_stack_fffffffffffff760,auVar10);
    auVar10 = vpaddd_avx2(local_6a0,auVar10);
    in_stack_00000008 = (ulong *)((long)in_stack_00000008 + (long)((int)m_ptr << 1));
    local_6a0 = auVar10;
  }
  auVar10 = vphaddd_avx2(local_6a0,local_6a0);
  auVar10 = vphaddd_avx2(auVar10,auVar10);
  local_6a0._0_4_ = auVar10._0_4_;
  local_6a0._16_4_ = auVar10._16_4_;
  return local_6a0._0_4_ + local_6a0._16_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad8xh_avx2(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i one = _mm256_set1_epi16(1);

  for (y = 0; y < height; y += 2) {
    const __m256i src = yy_loadu2_128(src_ptr + src_stride, src_ptr);
    const __m256i a = yy_loadu2_128(a_ptr + a_stride, a_ptr);
    const __m256i b = yy_loadu2_128(b_ptr + b_stride, b_ptr);
    // Zero-extend mask to 16 bits
    const __m256i m = _mm256_cvtepu8_epi16(_mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)(m_ptr)),
        _mm_loadl_epi64((const __m128i *)(m_ptr + m_stride))));
    const __m256i m_inv = _mm256_sub_epi16(mask_max, m);

    const __m256i data_l = _mm256_unpacklo_epi16(a, b);
    const __m256i mask_l = _mm256_unpacklo_epi16(m, m_inv);
    __m256i pred_l = _mm256_madd_epi16(data_l, mask_l);
    pred_l = _mm256_srai_epi32(_mm256_add_epi32(pred_l, round_const),
                               AOM_BLEND_A64_ROUND_BITS);

    const __m256i data_r = _mm256_unpackhi_epi16(a, b);
    const __m256i mask_r = _mm256_unpackhi_epi16(m, m_inv);
    __m256i pred_r = _mm256_madd_epi16(data_r, mask_r);
    pred_r = _mm256_srai_epi32(_mm256_add_epi32(pred_r, round_const),
                               AOM_BLEND_A64_ROUND_BITS);

    // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
    // so it is safe to do signed saturation here.
    const __m256i pred = _mm256_packs_epi32(pred_l, pred_r);
    // There is no 16-bit SAD instruction, so we have to synthesize
    // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
    // and accumulating them at the end
    const __m256i diff = _mm256_abs_epi16(_mm256_sub_epi16(pred, src));
    res = _mm256_add_epi32(res, _mm256_madd_epi16(diff, one));

    src_ptr += src_stride << 1;
    a_ptr += a_stride << 1;
    b_ptr += b_stride << 1;
    m_ptr += m_stride << 1;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int sad = _mm256_extract_epi32(res, 0) + _mm256_extract_epi32(res, 4);
  return sad;
}